

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::ValidateQualifiedName(protobuf *this,string_view name)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  const_iterator pvVar4;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 auStack_20 [7];
  bool last_was_period;
  string_view name_local;
  
  name_local._M_len = name._M_len;
  bVar2 = 0;
  _auStack_20 = this;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  do {
    if (__end2 == pvVar4) {
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      name_local._M_str._7_1_ = false;
      if (!bVar3) {
        name_local._M_str._7_1_ = (bool)(bVar2 ^ 1);
      }
      return name_local._M_str._7_1_;
    }
    cVar1 = *__end2;
    if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
       (((cVar1 < '0' || ('9' < cVar1)) && (cVar1 != '_')))) {
      if (cVar1 != '.') {
        return false;
      }
      if (bVar2 != 0) {
        return false;
      }
      bVar2 = 1;
    }
    else {
      bVar2 = 0;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static bool ValidateQualifiedName(absl::string_view name) {
  bool last_was_period = false;

  for (char character : name) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= character && character <= 'z') ||
        ('A' <= character && character <= 'Z') ||
        ('0' <= character && character <= '9') || (character == '_')) {
      last_was_period = false;
    } else if (character == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}